

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O0

bool __thiscall
ON_LocalZero1::BracketSpan(ON_LocalZero1 *this,double s0,double f0,double s1,double f1)

{
  bool bVar1;
  int iVar2;
  bool local_51;
  double dStack_50;
  bool rc;
  double fp;
  double fm;
  int local_38;
  int i;
  int i1;
  int i0;
  double f1_local;
  double s1_local;
  double f0_local;
  double s0_local;
  ON_LocalZero1 *this_local;
  
  local_51 = true;
  if ((this->m_k != (double *)0x0) && (2 < this->m_k_count)) {
    _i1 = f1;
    f1_local = s1;
    s1_local = f0;
    f0_local = s0;
    s0_local = (double)this;
    i = ON_SearchMonotoneArray(this->m_k,this->m_k_count,s0);
    if (i < 0) {
      i = 0;
    }
    local_38 = ON_SearchMonotoneArray(this->m_k,this->m_k_count,f1_local);
    if (this->m_k_count <= local_38) {
      local_38 = this->m_k_count + -1;
    }
    while( true ) {
      bVar1 = false;
      if (-1 < local_38) {
        bVar1 = f1_local == this->m_k[local_38];
      }
      iVar2 = i;
      if (!bVar1) break;
      local_38 = local_38 + -1;
    }
    do {
      i = iVar2 + 1;
      bVar1 = false;
      if (i < this->m_k_count + -1) {
        bVar1 = this->m_k[i] == this->m_k[iVar2 + 2];
      }
      iVar2 = i;
    } while (bVar1);
    if (i <= local_38) {
      (*this->_vptr_ON_LocalZero1[2])(this->m_k[i],this,&fp,0,0xffffffff);
      (*this->_vptr_ON_LocalZero1[2])(this->m_k[i],this,&stack0xffffffffffffffb0,0,1);
      if (((s1_local <= 0.0) && (0.0 <= fp)) || ((0.0 <= s1_local && (fp <= 0.0)))) {
        this->m_s1 = this->m_k[i];
        this->m_f1 = fp;
      }
      else if (((_i1 <= 0.0) && (0.0 <= dStack_50)) || ((0.0 <= _i1 && (dStack_50 <= 0.0)))) {
        this->m_s0 = this->m_k[i];
        this->m_f0 = dStack_50;
        if (i < local_38) {
          (*this->_vptr_ON_LocalZero1[2])(this->m_k[local_38],this,&fp,0,0xffffffff);
          (*this->_vptr_ON_LocalZero1[2])(this->m_k[local_38],this,&stack0xffffffffffffffb0,0,1);
          if (((_i1 <= 0.0) && (0.0 <= dStack_50)) || ((0.0 <= _i1 && (dStack_50 <= 0.0)))) {
            this->m_s0 = this->m_k[local_38];
            this->m_f0 = dStack_50;
          }
          else if (((s1_local <= 0.0) && (0.0 <= fp)) || ((0.0 <= s1_local && (fp <= 0.0)))) {
            this->m_s1 = this->m_k[local_38];
            this->m_f1 = fp;
            while (i + 1 < local_38) {
              fm._4_4_ = i + local_38 >> 1;
              (*this->_vptr_ON_LocalZero1[2])(this->m_k[fm._4_4_],this,&fp,0,0xffffffff);
              (*this->_vptr_ON_LocalZero1[2])(this->m_k[fm._4_4_],this,&stack0xffffffffffffffb0,0,1)
              ;
              if (((s1_local <= 0.0) && (0.0 <= fp)) || ((0.0 <= s1_local && (fp <= 0.0)))) {
                this->m_s1 = this->m_k[fm._4_4_];
                this->m_f1 = fp;
                local_38 = fm._4_4_;
                while( true ) {
                  bVar1 = false;
                  if (0 < local_38) {
                    bVar1 = this->m_k[local_38 + -1] == this->m_k[local_38];
                  }
                  if (!bVar1) break;
                  local_38 = local_38 + -1;
                }
              }
              else {
                if (((0.0 < _i1) || (dStack_50 < 0.0)) && ((_i1 < 0.0 || (0.0 < dStack_50)))) {
                  return false;
                }
                this->m_s0 = this->m_k[fm._4_4_];
                this->m_f0 = dStack_50;
                i = fm._4_4_;
                while( true ) {
                  bVar1 = false;
                  if (i < this->m_k_count + -2) {
                    bVar1 = this->m_k[i] == this->m_k[i + 1];
                  }
                  if (!bVar1) break;
                  i = i + 1;
                }
              }
            }
          }
          else {
            local_51 = false;
          }
        }
      }
      else {
        local_51 = false;
      }
    }
  }
  return local_51;
}

Assistant:

bool
ON_LocalZero1::BracketSpan( double s0, double f0, double s1, double f1 )
{
  int i0, i1, i;
  double fm, fp;
  bool rc = true;
  if ( m_k && m_k_count >= 3 ) {
    i0 = ON_SearchMonotoneArray(m_k,m_k_count,s0);
    if ( i0 < 0 )
      i0 = 0;
    i1 = ON_SearchMonotoneArray(m_k,m_k_count,s1);
    if ( i1 >= m_k_count )
      i1 = m_k_count-1;
    while ( i1 >= 0 && s1 == m_k[i1] ) {
      i1--;
    }
    i0++;
    while ( i0 < m_k_count-1 && m_k[i0] == m_k[i0+1] )
      i0++;
    if ( i0 <= i1 ) {
      // we have s0 < m_k[i0] <= ... <= m_k[i1] < s1
      Evaluate( m_k[i0], &fm, nullptr,-1 ); // guard against C0 discontinuities
      Evaluate( m_k[i0], &fp, nullptr, 1 );
      if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
        m_s1 = m_k[i0];
        m_f1 = fm;
      }
      else if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
        m_s0 = m_k[i0];
        m_f0 = fp;
        if ( i0 < i1 ) {
          Evaluate( m_k[i1], &fm, nullptr, -1 );
          Evaluate( m_k[i1], &fp, nullptr,  1 );
          if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
            m_s0 = m_k[i1];
            m_f0 = fp;
          }
          else if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
            m_s1 = m_k[i1];
            m_f1 = fm;
            // we have s0 = m_k[i0] < m_k[i1] = s1 and a bonafide sign change
            while (i0+1 < i1) {
              // bisect m_k[i0],...,m_k[i1] until we get a sign change between
              // m_k[i],m_k[i+1].  We need to do this in order to make sure
              // we are passing a C2 function to the repeated zero finders.
              i = (i0+i1)>>1;
              Evaluate( m_k[i], &fm, nullptr, -1 );
              Evaluate( m_k[i], &fp, nullptr,  1 );
              if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
                m_s1 = m_k[i];
                m_f1 = fm;
                i1 = i;
                while ( i1>0 && m_k[i1-1]==m_k[i1])
                  i1--;
              }
              else if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
                m_s0 = m_k[i];
                m_f0 = fp;
                i0 = i;
                while ( i0 < m_k_count-2 && m_k[i0] == m_k[i0+1] )
                  i0++;
              }
              else {
                // discontinuous sign change across m_k[i]
                rc = false;
                break;
              }
            }
          }
          else {
            // discontinuous sign change across m_k[i1]
            rc = false;
          }
        }
      }
      else {
        // discontinuous sign change across m_k[i0]
        rc = false;
      }
    }
  }
  return rc;
}